

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O1

Ray * __thiscall
ThinLensCamera::generateRay
          (Ray *__return_storage_ptr__,ThinLensCamera *this,int x,int y,mt19937 *rng)

{
  Vector3f *v;
  Vector3f *v0;
  Vector3f *v2;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  Ray *pRVar4;
  result_type rVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar17 [16];
  undefined1 in_ZMM2 [64];
  undefined1 in_XMM3 [16];
  Vector3f df;
  Vector3f g;
  Vector3f local_104;
  double local_f8;
  Ray *local_f0;
  Vector3f local_e4;
  Vector3f local_d8;
  Vector3f local_cc [2];
  Vector3f local_b4;
  undefined1 local_a8 [24];
  Vector3f local_90;
  undefined1 local_84 [12];
  Matrix3f local_78;
  Matrix3f local_54;
  
  auVar11 = in_ZMM2._0_16_;
  auVar9 = in_ZMM1._0_16_;
  local_f0 = __return_storage_ptr__;
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(rng);
  auVar9 = vcvtusi2sd_avx512f(auVar9,rVar5);
  auVar8._0_8_ = auVar9._0_8_ / 4294967295.0;
  auVar8._8_8_ = auVar9._8_8_;
  auVar9._0_4_ = (float)auVar8._0_8_;
  auVar9._4_12_ = auVar8._4_12_;
  if (auVar9._0_4_ < 0.0) {
    fVar7 = sqrtf(auVar9._0_4_);
  }
  else {
    auVar9 = vsqrtss_avx(auVar9,auVar9);
    fVar7 = auVar9._0_4_;
  }
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(rng);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = (double)fVar7;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (double)x;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = 0.5 - (double)((uint)rVar5 & 1);
  auVar8 = vfmadd213sd_fma(auVar10,auVar16,auVar1);
  iVar3 = (this->super_Camera).width;
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(rng);
  auVar9 = vcvtusi2sd_avx512f(auVar11,rVar5);
  auVar11._0_8_ = auVar9._0_8_ / 4294967295.0;
  auVar11._8_8_ = auVar9._8_8_;
  auVar12._0_4_ = (float)auVar11._0_8_;
  auVar12._4_12_ = auVar11._4_12_;
  if (auVar12._0_4_ < 0.0) {
    fVar7 = sqrtf(auVar12._0_4_);
  }
  else {
    auVar9 = vsqrtss_avx(auVar12,auVar12);
    fVar7 = auVar9._0_4_;
  }
  local_f8 = (double)fVar7;
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(rng);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_f8;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (double)y;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = 0.5 - (double)((uint)rVar5 & 1);
  auVar9 = vfmadd213sd_fma(auVar13,auVar17,auVar2);
  Vector3f::Vector3f(&local_d8,(float)(auVar8._0_8_ + (double)((float)(iVar3 + -1) * -0.5)),
                     (float)(auVar9._0_8_ +
                            (double)((float)((this->super_Camera).height + -1) * -0.5)),this->dist);
  Vector3f::normalize(&local_d8);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(rng);
  auVar9 = vcvtusi2sd_avx512f(in_XMM3,rVar5);
  fVar7 = (float)(auVar9._0_8_ / 4294967295.0) * 6.2831855;
  v = &(this->super_Camera).up;
  fVar6 = cosf(fVar7);
  ::operator*((Vector3f *)&local_54,fVar6);
  v0 = &(this->super_Camera).horizontal;
  fVar7 = sinf(fVar7);
  ::operator*((Vector3f *)(local_84 + 0xc),fVar7);
  operator+((Vector3f *)&local_54,(Vector3f *)(local_84 + 0xc));
  fVar7 = this->radius;
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(rng);
  auVar9 = vcvtusi2sd_avx512f(in_XMM3,rVar5);
  auVar14._0_8_ = auVar9._0_8_ / 4294967295.0;
  auVar14._8_8_ = auVar9._8_8_;
  auVar15._0_4_ = (float)auVar14._0_8_;
  auVar15._4_12_ = auVar14._4_12_;
  if (auVar15._0_4_ < 0.0) {
    fVar6 = sqrtf(auVar15._0_4_);
  }
  else {
    auVar9 = vsqrtss_avx(auVar15,auVar15);
    fVar6 = auVar9._0_4_;
  }
  Vector3f::operator*=(&local_104,fVar6 * fVar7);
  operator-(v);
  v2 = &(this->super_Camera).direction;
  Matrix3f::Matrix3f(&local_54,v0,&local_90,v2,true);
  ::operator*((Matrix3f *)local_84,(Vector3f *)&local_54);
  operator+(&(this->super_Camera).center,(Vector3f *)local_84);
  operator-(v);
  Matrix3f::Matrix3f((Matrix3f *)(local_84 + 0xc),v0,&local_b4,v2,true);
  ::operator*(local_cc,this->length);
  operator-(local_cc,&local_104);
  ::operator*((Matrix3f *)local_a8,(Vector3f *)(local_84 + 0xc));
  Vector3f::normalized((Vector3f *)(local_a8 + 0xc));
  pRVar4 = local_f0;
  Vector3f::Vector3f(&local_f0->o,&local_e4);
  Vector3f::Vector3f(&pRVar4->d,(Vector3f *)(local_a8 + 0xc));
  pRVar4->tmax = 3.4028235e+38;
  return pRVar4;
}

Assistant:

Ray generateRay(int x, int y, RNG_TYPE& rng) const override {
		Vector3f g(x + sqrtf(randf(rng)) * (0.5 - rng() % 2) - (width - 1) / 2.0f,
			y + sqrtf(randf(rng)) * (0.5 - rng() % 2) - (height - 1) / 2.0f, dist);
		//Vector3f g((x+randf(rng)-0.5 - (width - 1) / 2.0f), (y+randf(rng)-0.5 - (height - 1) / 2.0f), dist);
		g.normalize();
		float a = randf(rng) * (2 * PI);
		Vector3f df = up * cosf(a) + horizontal * sinf(a); df *= radius*sqrtf(randf(rng));
		return Ray(center + (Matrix3f(horizontal, -up, direction, 1)*df), (Matrix3f(horizontal, -up, direction, 1) *
			(g * length - df)).normalized());
	}